

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O3

void __thiscall
Reset_removeResetInvalidArguments_Test::~Reset_removeResetInvalidArguments_Test
          (Reset_removeResetInvalidArguments_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, removeResetInvalidArguments)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ResetPtr r1 = libcellml::Reset::create();
    r1->setOrder(2);

    libcellml::ResetPtr r2 = libcellml::Reset::create();

    // Add r1 to c.
    EXPECT_TRUE(c->addReset(r1));

    // Try and remove the ones which don't exist so we trigger the 'false' return statement.
    EXPECT_FALSE(c->removeReset(1));
    EXPECT_EQ(size_t(1), c->resetCount());
    EXPECT_FALSE(c->removeReset(r2));
    EXPECT_EQ(size_t(1), c->resetCount());
}